

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O0

REF_STATUS ref_layer_tet_prism(REF_INT *pri_nodes,REF_INT *tet_nodes,REF_BOOL *contains)

{
  int local_34;
  int local_30;
  REF_INT pri_node;
  REF_INT tet_node;
  REF_INT hits;
  REF_BOOL *contains_local;
  REF_INT *tet_nodes_local;
  REF_INT *pri_nodes_local;
  
  *contains = 0;
  pri_node = 0;
  for (local_34 = 0; local_34 < 6; local_34 = local_34 + 1) {
    for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
      if (pri_nodes[local_34] == tet_nodes[local_30]) {
        pri_node = pri_node + 1;
      }
    }
  }
  if (pri_node < 5) {
    if (pri_node == 4) {
      *contains = 1;
    }
    pri_nodes_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x2e2,
           "ref_layer_tet_prism","repeated tet nodes in prism");
    printf("hits %d\n",(ulong)(uint)pri_node);
    pri_nodes_local._4_4_ = 1;
  }
  return pri_nodes_local._4_4_;
}

Assistant:

static REF_FCN REF_STATUS ref_layer_tet_prism(REF_INT *pri_nodes,
                                              REF_INT *tet_nodes,
                                              REF_BOOL *contains) {
  REF_INT hits, tet_node, pri_node;
  *contains = REF_FALSE;
  hits = 0;
  for (pri_node = 0; pri_node < 6; pri_node++) {
    for (tet_node = 0; tet_node < 4; tet_node++) {
      if (pri_nodes[pri_node] == tet_nodes[tet_node]) {
        hits++;
      }
    }
  }
  RAB(hits <= 4, "repeated tet nodes in prism", { printf("hits %d\n", hits); });
  if (4 == hits) *contains = REF_TRUE;
  return REF_SUCCESS;
}